

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbwindow.cpp
# Opt level: O0

void __thiscall QFbWindow::setGeometry(QFbWindow *this,QRect *rect)

{
  bool bVar1;
  QWindow *pQVar2;
  QPoint *this_00;
  QRect *this_01;
  QRect *in_RSI;
  QPoint *in_RDI;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  QRect *in_stack_ffffffffffffff90;
  QPoint *atopLeft;
  undefined1 local_30 [16];
  QRegion local_20 [8];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  atopLeft = in_RDI;
  local_18 = (**(code **)((long)*in_RDI + 0x30))();
  *(undefined1 (*) [16])(in_RDI + 4) = local_18;
  pQVar2 = (QWindow *)QPlatformWindow::window();
  QWindowSystemInterface::handleGeometryChange<QWindowSystemInterface::DefaultDelivery>
            (pQVar2,(QRect *)in_RSI);
  QPlatformWindow::setGeometry((QRect *)in_RDI);
  bVar1 = operator!=(in_stack_ffffffffffffff90,
                     (QRect *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (bVar1) {
    this_00 = (QPoint *)QPlatformWindow::window();
    QPoint::QPoint(this_00,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    this_01 = (QRect *)(**(code **)((long)*in_RDI + 0x30))();
    QRect::size(in_RSI);
    QRect::QRect(this_01,atopLeft,(QSize *)in_RSI);
    QRegion::QRegion(local_20,local_30,0);
    QWindowSystemInterface::handleExposeEvent<QWindowSystemInterface::DefaultDelivery>
              ((QWindow *)this_00,local_20);
    QRegion::~QRegion(local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFbWindow::setGeometry(const QRect &rect)
{
    // store previous geometry for screen update
    mOldGeometry = geometry();

    QWindowSystemInterface::handleGeometryChange(window(), rect);

    QPlatformWindow::setGeometry(rect);

    if (mOldGeometry != rect)
        QWindowSystemInterface::handleExposeEvent(window(), QRect(QPoint(0, 0), geometry().size()));
}